

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O2

void __thiscall
VW::config::typed_option<int>::typed_option(typed_option<int> *this,string *name,int *location)

{
  size_t type_hash;
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)name);
  type_hash = std::type_info::hash_code((type_info *)&int::typeinfo);
  config::base_option::base_option(&this->super_base_option,&sStack_38,type_hash);
  std::__cxx11::string::~string((string *)&sStack_38);
  (this->super_base_option)._vptr_base_option = (_func_int **)&PTR__typed_option_002a29b0;
  this->m_location = location;
  (this->m_value).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->m_value).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_default_value).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_default_value).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

typed_option(const std::string& name, T& location) : base_option(name, typeid(T).hash_code()), m_location{location} {}